

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Performance::loopFragmentTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,LoopType type,bool isVertexCase,
          int numLoopIterations,int nestingDepth)

{
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000009;
  char *local_248;
  allocator<char> local_229;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  allocator<char> local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  undefined1 local_80 [8];
  string iterName;
  allocator<char> local_55;
  int i;
  undefined1 local_48 [8];
  string loopBound;
  int local_1c;
  int nestingDepth_local;
  int numLoopIterations_local;
  bool isVertexCase_local;
  string *psStack_10;
  LoopType type_local;
  string *resultTemplate;
  
  numLoopIterations_local = (int)this;
  nestingDepth_local._3_1_ = (byte)type & 1;
  local_1c = (int)CONCAT71(in_register_00000009,isVertexCase);
  loopBound.field_2._M_local_buf[0xf] = '\0';
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = false;
  if (numLoopIterations_local == 0) {
    de::toString<int>((string *)local_48,&local_1c);
  }
  else {
    if (numLoopIterations_local == 1) {
      local_248 = "int(u_loopBound${NAME_SPEC})";
    }
    else {
      local_248 = "";
      if (numLoopIterations_local == 2) {
        local_248 = "int(v_loopBound${NAME_SPEC})";
      }
    }
    std::allocator<char>::allocator();
    bVar1 = true;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,local_248,&local_55);
  }
  if (bVar1) {
    std::allocator<char>::~allocator(&local_55);
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,"varying mediump vec4 v_value${NAME_SPEC};\n");
  if ((nestingDepth_local._3_1_ & 1) == 0) {
    if (numLoopIterations_local == 2) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,"varying mediump float v_loopBound${NAME_SPEC};\n"
                );
    }
    else if (numLoopIterations_local == 1) {
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,"uniform mediump float u_loopBound${NAME_SPEC};\n"
                );
    }
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "\nvoid main()\n{\n\tmediump vec4 value = v_value${NAME_SPEC};\n");
    for (iterName.field_2._12_4_ = 0; (int)iterName.field_2._12_4_ < numLoopIterations;
        iterName.field_2._12_4_ = iterName.field_2._12_4_ + 1) {
      de::toString<int>(&local_a0,(int *)(iterName.field_2._M_local_buf + 0xc));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     "i",&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      iVar2 = iterName.field_2._12_4_ + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,(long)iVar2,'\t',&local_1e1);
      std::operator+(&local_1c0,&local_1e0,"for (int ");
      std::operator+(&local_1a0,&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::operator+(&local_180,&local_1a0," = 0; ");
      std::operator+(&local_160,&local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::operator+(&local_140,&local_160," < ");
      std::operator+(&local_120,&local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      std::operator+(&local_100,&local_120,"; ");
      std::operator+(&local_e0,&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::operator+(&local_c0,&local_e0,"++)\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      std::__cxx11::string::~string((string *)local_80);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,(long)(numLoopIterations + 1),'\t',&local_229);
    std::operator+(&local_208,&local_228,"value *= v_value${NAME_SPEC};\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,"\tgl_FragColor = value + ${FLOAT01};\n");
  }
  else {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "\nvoid main()\n{\n\tgl_FragColor = v_value${NAME_SPEC} + ${FLOAT01};\n");
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,"${SEMANTIC_ERROR}}\n${INVALID_CHAR}");
  loopBound.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_48);
  if ((loopBound.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static string loopFragmentTemplate (LoopType type, bool isVertexCase, int numLoopIterations, int nestingDepth)
{
	string resultTemplate;
	string loopBound		= type == LOOP_TYPE_STATIC	? de::toString(numLoopIterations)
							: type == LOOP_TYPE_UNIFORM	? "int(u_loopBound${NAME_SPEC})"
							: type == LOOP_TYPE_DYNAMIC	? "int(v_loopBound${NAME_SPEC})"
							: "";

	DE_ASSERT(!loopBound.empty());

	resultTemplate +=
		"varying mediump vec4 v_value${NAME_SPEC};\n";

	if (!isVertexCase)
	{
		if (type == LOOP_TYPE_DYNAMIC)
			resultTemplate +=
				"varying mediump float v_loopBound${NAME_SPEC};\n";
		else if (type == LOOP_TYPE_UNIFORM)
			resultTemplate +=
				"uniform mediump float u_loopBound${NAME_SPEC};\n";

		resultTemplate +=
			"\n"
			"void main()\n"
			"{\n"
			"	mediump vec4 value = v_value${NAME_SPEC};\n";

		for (int i = 0; i < nestingDepth; i++)
		{
			string iterName = "i" + de::toString(i);
			resultTemplate += string(i + 1, '\t') + "for (int " + iterName + " = 0; " + iterName + " < " + loopBound + "; " + iterName + "++)\n";
		}

		resultTemplate += string(nestingDepth + 1, '\t') + "value *= v_value${NAME_SPEC};\n";

		resultTemplate +=
			"	gl_FragColor = value + ${FLOAT01};\n";
	}
	else
		resultTemplate +=
			"\n"
			"void main()\n"
			"{\n"
			"	gl_FragColor = v_value${NAME_SPEC} + ${FLOAT01};\n";

	resultTemplate +=
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}